

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.h
# Opt level: O3

bool __thiscall Js::ByteCodeWriter::DoProfileNewScObjArrayOp(ByteCodeWriter *this,OpCode op)

{
  byte bVar1;
  FunctionBody *pFVar2;
  Utf8SourceInfo *pUVar3;
  code *pcVar4;
  bool bVar5;
  uint sourceContextId;
  undefined4 *puVar6;
  FunctionInfo *pFVar7;
  
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
  pFVar2 = this->m_functionWrite;
  pFVar7 = (pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar7 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
    pFVar7 = (pFVar2->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar5 = Phases::IsEnabled((Phases *)&DAT_015a4e90,NativeArrayPhase,sourceContextId,
                            pFVar7->functionId);
  if ((bVar5) ||
     (pUVar3 = (this->m_functionWrite->super_ParseableFunctionInfo).super_FunctionProxy.
               m_utf8SourceInfo.ptr, bVar1 = pUVar3->field_0xa8,
     (byte)((bVar1 >> 5 | (pUVar3->debugModeSource).ptr != (uchar *)0x0) & (bVar1 & 0x40) >> 6) != 0
     )) {
    bVar5 = false;
  }
  else {
    bVar5 = (op - NewScObjArray & 0xfffd) == 0;
  }
  return bVar5;
}

Assistant:

bool DoProfileNewScObjArrayOp(OpCode op)
        {
            return
                !PHASE_OFF(NativeArrayPhase, m_functionWrite) &&
                !m_functionWrite->IsInDebugMode() &&
                (op == OpCode::NewScObjArray || op == OpCode::NewScObjArraySpread);
        }